

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso8859_11.h
# Opt level: O0

int iso8859_11_wctomb(void *conv,uchar *r,uint wc,int n)

{
  uchar local_29;
  uchar c;
  int n_local;
  uint wc_local;
  uchar *r_local;
  void *conv_local;
  
  local_29 = '\0';
  if ((wc < 0x80) || (wc == 0xa0)) {
    *r = (uchar)wc;
    conv_local._4_4_ = 1;
  }
  else {
    if ((0xdff < wc) && (wc < 0xe60)) {
      local_29 = ""[wc - 0xe00];
    }
    if (local_29 == '\0') {
      conv_local._4_4_ = -1;
    }
    else {
      *r = local_29;
      conv_local._4_4_ = 1;
    }
  }
  return conv_local._4_4_;
}

Assistant:

static int
iso8859_11_wctomb (conv_t conv, unsigned char *r, ucs4_t wc, int n)
{
  unsigned char c = 0;
  if (wc < 0x0080 || wc == 0x00a0) {
    *r = wc;
    return 1;
  }
  else if (wc >= 0x0e00 && wc < 0x0e60)
    c = iso8859_11_page0e[wc-0x0e00];
  if (c != 0) {
    *r = c;
    return 1;
  }
  return RET_ILSEQ;
}